

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextRightSemiOrAntiJoin(ScanStructure *this,DataChunk *keys)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  idx_t iVar7;
  
  pdVar1 = (this->pointers).data;
  while (this->count != 0) {
    iVar3 = ResolvePredicates(this,keys,&this->chain_match_sel_vector,(SelectionVector *)0x0);
    for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
      psVar2 = (this->chain_match_sel_vector).sel_vector;
      iVar5 = iVar4;
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[iVar4];
      }
      lVar6 = *(long *)(pdVar1 + iVar5 * 8);
      iVar7 = this->ht->tuple_size;
      if ((*(byte *)(lVar6 + iVar7) & 1) == 0) {
        while( true ) {
          *(undefined1 *)(lVar6 + iVar7) = 1;
          lVar6 = *(long *)(*(long *)(pdVar1 + iVar5 * 8) + this->ht->pointer_offset);
          if (lVar6 == 0) break;
          *(long *)(pdVar1 + iVar5 * 8) = lVar6;
          iVar7 = this->ht->tuple_size;
        }
      }
      else {
        *(uchar **)(pdVar1 + iVar5 * 8) =
             (this->ht->dead_end).
             super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      }
    }
    AdvancePointers(this);
  }
  this->finished = true;
  return;
}

Assistant:

void ScanStructure::NextRightSemiOrAntiJoin(DataChunk &keys) {
	const auto ptrs = FlatVector::GetData<data_ptr_t>(pointers);
	while (!PointersExhausted()) {
		// resolve the equality_predicates for this set of keys
		idx_t result_count = ResolvePredicates(keys, chain_match_sel_vector, nullptr);

		// for each match, fully follow the chain
		for (idx_t i = 0; i < result_count; i++) {
			const auto idx = chain_match_sel_vector.get_index(i);
			auto &ptr = ptrs[idx];
			if (Load<bool>(ptr + ht.tuple_size)) { // Early out: chain has been fully marked as found before
				ptr = ht.dead_end.get();
				continue;
			}

			// Fully mark chain as found
			while (true) {
				// NOTE: threadsan reports this as a data race because this can be set concurrently by separate threads
				// Technically it is, but it does not matter, since the only value that can be written is "true"
				Store<bool>(true, ptr + ht.tuple_size);
				auto next_ptr = LoadPointer(ptr + ht.pointer_offset);
				if (!next_ptr) {
					break;
				}
				ptr = next_ptr;
			}
		}

		// check the next set of pointers
		AdvancePointers();
	}

	finished = true;
}